

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_containers.cc
# Opt level: O0

ptr_value_t ptr_value(void *ptr)

{
  void *ptr_local;
  
  return (ptr_value_t)ptr;
}

Assistant:

BOOST_AUTO_TEST_CASE( test_vector_assumptions )
{
    // It is expected that ->size() depends on the type of the vector elements,
    // but that the size can be offset by using the ratio of sizeof()
    {
        vector<int32_t> values;
        values.resize(10);
        BOOST_REQUIRE_EQUAL(10, values.size());
        BOOST_REQUIRE_EQUAL(5, reinterpret_cast< vector<int64_t>& >(values).size());
    }
    {
        vector< vector<double> > values;
        values.resize(10);
        BOOST_REQUIRE_EQUAL(10, values.size());
        BOOST_REQUIRE_EQUAL(10 * sizeof(vector<double>), reinterpret_cast< vector<int8_t>& >(values).size());
    }

    // To resize the containers efficiently, we assume that moving the bytes
    // around is fine. This is a valid assumption only if the std::vector's
    // internal structure does not store any pointer to the memory location
    //
    // This tests that this assumption is valid
    {
        vector< vector<double> > values;
        values.resize(10);

        uint8_t* values_p = reinterpret_cast<uint8_t*>(&values);
        uint8_t* it_p     = reinterpret_cast<uint8_t*>(&values);
        ptr_value_t vector_min = ptr_value(&values);
        ptr_value_t vector_max = ptr_value(&values) + sizeof(values);

        while ((it_p + sizeof(void*)) - values_p < static_cast<int>(sizeof(values)))
        {
            ptr_value_t p = *reinterpret_cast<ptr_value_t*>(it_p);
            BOOST_REQUIRE(!(p >= vector_min && p < vector_max));
            ++it_p;
        }
    }
}